

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O2

void mxx::impl::allgather_big<std::pair<int,double>>
               (pair<int,_double> *data,size_t size,pair<int,_double> *out,comm *comm)

{
  datatype dt;
  datatype dt_1;
  
  dt_1.mpitype = datatype_builder<std::pair<int,_double>_>::get_type();
  dt_1._vptr_datatype = (_func_int **)&PTR__datatype_00171c90;
  dt_1.builtin = false;
  datatype::contiguous(&dt,&dt_1,size);
  datatype::~datatype(&dt_1);
  MPI_Allgather(data,1,dt.mpitype,out,1,dt.mpitype,comm->mpi_comm);
  datatype::~datatype(&dt);
  return;
}

Assistant:

void allgather_big(const T* data, size_t size, T* out, const mxx::comm& comm) {
    // implementation of scatter for messages sizes that exceed MAX_INT
    mxx::datatype dt = mxx::get_datatype<T>().contiguous(size);
    MPI_Allgather(const_cast<T*>(data), 1, dt.type(), out, 1, dt.type(), comm);
}